

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::usda::USDAReader::Impl::Read(Impl *this,uint32_t state_flags,bool as_primspec)

{
  ulong uVar1;
  ostream *poVar2;
  bool bVar3;
  string local_3d8;
  string local_3b8;
  string local_398 [32];
  ostringstream local_378 [8];
  ostringstream ss_e;
  string local_200;
  string local_1e0 [32];
  ostringstream local_1c0 [8];
  ostringstream ss_w;
  undefined1 local_48 [8];
  string warn;
  AsciiParserOption local_20;
  byte local_1d;
  uint32_t uStack_1c;
  bool ret;
  AsciiParserOption ascii_parser_option;
  bool as_primspec_local;
  uint32_t state_flags_local;
  Impl *this_local;
  
  local_1d = as_primspec;
  uStack_1c = state_flags;
  _ascii_parser_option = this;
  ascii::AsciiParserOption::AsciiParserOption(&local_20);
  local_20.allow_unknown_prim = (bool)((this->_config).allow_unknown_prims & 1);
  local_20.allow_unknown_apiSchema = (bool)((this->_config).allow_unknown_apiSchema & 1);
  local_20.strict_allowedToken_check = (bool)((this->_config).strict_allowedToken_check & 1);
  StageMetaProcessor(this);
  RegisterPrimIdxAssignCallback(this);
  RegisterPrimSpecHandler(this);
  RegisterReconstructCallback<tinyusdz::Model>(this);
  RegisterReconstructCallback<tinyusdz::GPrim>(this);
  RegisterReconstructCallback<tinyusdz::Xform>(this);
  RegisterReconstructCallback<tinyusdz::GeomCube>(this);
  RegisterReconstructCallback<tinyusdz::GeomSphere>(this);
  RegisterReconstructCallback<tinyusdz::GeomCone>(this);
  RegisterReconstructCallback<tinyusdz::GeomPoints>(this);
  RegisterReconstructCallback<tinyusdz::GeomCylinder>(this);
  RegisterReconstructCallback<tinyusdz::GeomCapsule>(this);
  RegisterReconstructCallback<tinyusdz::GeomMesh>(this);
  RegisterReconstructCallback<tinyusdz::GeomSubset>(this);
  RegisterReconstructCallback<tinyusdz::GeomBasisCurves>(this);
  RegisterReconstructCallback<tinyusdz::GeomNurbsCurves>(this);
  RegisterReconstructCallback<tinyusdz::GeomCamera>(this);
  RegisterReconstructCallback<tinyusdz::Material>(this);
  RegisterReconstructCallback<tinyusdz::Shader>(this);
  RegisterReconstructCallback<tinyusdz::Scope>(this);
  RegisterReconstructCallback<tinyusdz::SphereLight>(this);
  RegisterReconstructCallback<tinyusdz::DomeLight>(this);
  RegisterReconstructCallback<tinyusdz::DiskLight>(this);
  RegisterReconstructCallback<tinyusdz::DistantLight>(this);
  RegisterReconstructCallback<tinyusdz::CylinderLight>(this);
  RegisterReconstructCallback<tinyusdz::SkelRoot>(this);
  RegisterReconstructCallback<tinyusdz::Skeleton>(this);
  RegisterReconstructCallback<tinyusdz::SkelAnimation>(this);
  RegisterReconstructCallback<tinyusdz::BlendShape>(this);
  ascii::AsciiParser::set_primspec_mode(&this->_parser,(bool)(local_1d & 1));
  warn.field_2._M_local_buf[0xf] = ascii::AsciiParser::Parse(&this->_parser,uStack_1c,&local_20);
  ascii::AsciiParser::GetWarning_abi_cxx11_((string *)local_48,&this->_parser);
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1c0);
    poVar2 = ::std::operator<<((ostream *)local_1c0,"[warn]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"Read");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x6a0);
    ::std::operator<<(poVar2," ");
    ::std::operator+((char *)local_1e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "<USDAParser> ");
    poVar2 = ::std::operator<<((ostream *)local_1c0,local_1e0);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::~string(local_1e0);
    ::std::__cxx11::ostringstream::str();
    PushWarn(this,&local_200);
    ::std::__cxx11::string::~string((string *)&local_200);
    ::std::__cxx11::ostringstream::~ostringstream(local_1c0);
  }
  bVar3 = (warn.field_2._M_local_buf[0xf] & 1U) != 0;
  if (!bVar3) {
    ::std::__cxx11::ostringstream::ostringstream(local_378);
    poVar2 = ::std::operator<<((ostream *)local_378,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"Read");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x6a4);
    ::std::operator<<(poVar2," ");
    ascii::AsciiParser::GetError_abi_cxx11_(&local_3b8,&this->_parser);
    ::std::operator+((char *)local_398,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Parse failed:\n");
    poVar2 = ::std::operator<<((ostream *)local_378,local_398);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::~string(local_398);
    ::std::__cxx11::string::~string((string *)&local_3b8);
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_3d8);
    ::std::__cxx11::string::~string((string *)&local_3d8);
    ::std::__cxx11::ostringstream::~ostringstream(local_378);
  }
  ::std::__cxx11::string::~string((string *)local_48);
  return bVar3;
}

Assistant:

bool USDAReader::Impl::Read(const uint32_t state_flags, bool as_primspec) {

  ///
  /// Convert parser option.
  ///
  ascii::AsciiParserOption ascii_parser_option;
  ascii_parser_option.allow_unknown_prim = _config.allow_unknown_prims;
  ascii_parser_option.allow_unknown_apiSchema = _config.allow_unknown_apiSchema;
  ascii_parser_option.strict_allowedToken_check = _config.strict_allowedToken_check;

  ///
  /// Setup callbacks.
  ///
  StageMetaProcessor();

  RegisterPrimIdxAssignCallback();

  // For composition(as_primspec == true)
  RegisterPrimSpecHandler();

  // For direct Prim reconstruction(load state = Toplevel)
  RegisterReconstructCallback<Model>();  // Generic prim.

  RegisterReconstructCallback<GPrim>(); // Geometric prim

  RegisterReconstructCallback<Xform>();
  RegisterReconstructCallback<GeomCube>();
  RegisterReconstructCallback<GeomSphere>();
  RegisterReconstructCallback<GeomCone>();
  RegisterReconstructCallback<GeomPoints>();
  RegisterReconstructCallback<GeomCylinder>();
  RegisterReconstructCallback<GeomCapsule>();
  RegisterReconstructCallback<GeomMesh>();
  RegisterReconstructCallback<GeomSubset>();
  RegisterReconstructCallback<GeomBasisCurves>();
  RegisterReconstructCallback<GeomNurbsCurves>();
  RegisterReconstructCallback<GeomCamera>();

  RegisterReconstructCallback<Material>();
  RegisterReconstructCallback<Shader>();

  RegisterReconstructCallback<Scope>();

  RegisterReconstructCallback<SphereLight>();
  RegisterReconstructCallback<DomeLight>();
  RegisterReconstructCallback<DiskLight>();
  RegisterReconstructCallback<DistantLight>();
  RegisterReconstructCallback<CylinderLight>();

  RegisterReconstructCallback<SkelRoot>();
  RegisterReconstructCallback<Skeleton>();
  RegisterReconstructCallback<SkelAnimation>();
  RegisterReconstructCallback<BlendShape>();

  _parser.set_primspec_mode(as_primspec);

  bool ret = _parser.Parse(state_flags, ascii_parser_option);

  std::string warn = _parser.GetWarning();
  if (!warn.empty()) {
    PUSH_WARN("<USDAParser> " + warn);
  }

  if (!ret) {
    PUSH_ERROR_AND_RETURN("Parse failed:\n" + _parser.GetError());
  }


  return true;
}